

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void object_suite::fail_trailing_separator(void)

{
  error_code eVar1;
  undefined4 local_1f4;
  int local_1f0 [2];
  error_category *local_1e8;
  undefined1 local_1df;
  undefined1 local_1de [2];
  undefined4 local_1dc;
  size_type local_1d8 [2];
  undefined4 local_1c8;
  value local_1c4;
  undefined1 local_1bf;
  undefined1 local_1be [2];
  undefined4 local_1bc;
  size_type local_1b8 [2];
  undefined4 local_1a8;
  value local_1a4;
  undefined1 local_19f;
  undefined1 local_19e [2];
  undefined4 local_19c;
  size_type local_198 [3];
  undefined4 local_17c;
  value local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [11];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = 0x3a2279656b227b;
  stack0xffffffffffffffef = 0x7d2c31;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_17c = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x342,"void object_suite::fail_trailing_separator()",local_178,&local_17c);
  local_198[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_19c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x343,"void object_suite::fail_trailing_separator()",local_198,&local_19c);
  local_19e[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_19f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x344,"void object_suite::fail_trailing_separator()",local_19e,&local_19f);
  local_1a4 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1a8 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x345,"void object_suite::fail_trailing_separator()",&local_1a4,&local_1a8);
  local_1b8[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_1bc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x346,"void object_suite::fail_trailing_separator()",local_1b8,&local_1bc);
  local_1be[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1bf = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x347,"void object_suite::fail_trailing_separator()",local_1be,&local_1bf);
  local_1c4 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1c8 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x348,"void object_suite::fail_trailing_separator()",&local_1c4,&local_1c8);
  local_1d8[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_1dc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x349,"void object_suite::fail_trailing_separator()",local_1d8,&local_1dc);
  local_1de[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1df = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x34a,"void object_suite::fail_trailing_separator()",local_1de,&local_1df);
  eVar1 = trial::protocol::json::basic_reader<char>::error((basic_reader<char> *)local_160);
  local_1e8 = eVar1._M_cat;
  local_1f0[0] = eVar1._M_value;
  local_1f4 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x34b,"void object_suite::fail_trailing_separator()",local_1f0,&local_1f4);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void fail_trailing_separator()
{
    const char input[] = "{\"key\":1,}";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::unexpected_token);
}